

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.c
# Opt level: O0

void nn_xpub_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist *self_00;
  nn_pipe *in_RSI;
  nn_dist_data *in_RDI;
  nn_xpub_data *data;
  nn_xpub *xpub;
  
  if (in_RDI == (nn_dist_data *)0x0) {
    in_RDI = (nn_dist_data *)0x0;
  }
  self_00 = (nn_dist *)nn_pipe_getdata(in_RSI);
  nn_dist_rm(self_00,in_RDI);
  nn_free((void *)0x13dafe);
  return;
}

Assistant:

static void nn_xpub_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpub *xpub;
    struct nn_xpub_data *data;

    xpub = nn_cont (self, struct nn_xpub, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_dist_rm (&xpub->outpipes, &data->item);

    nn_free (data);
}